

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

bool __thiscall spirv_cross::CFG::post_order_visit(CFG *this,uint32_t block_id)

{
  int iVar1;
  Case *pCVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  mapped_type *pmVar6;
  SPIRBlock *block;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *pSVar7;
  _Hash_node_base *p_Var8;
  __hash_code __code;
  ulong uVar9;
  uint32_t uVar10;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  __node_base_ptr p_Var13;
  long lVar14;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  uint32_t local_3c;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_3c = block_id;
  bVar5 = has_visited_forward_edge(this,block_id);
  if (bVar5) {
    return true;
  }
  bVar5 = is_back_edge(this,block_id);
  if (bVar5) {
    return false;
  }
  this_00 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&this->visit_order;
  pmVar6 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_3c);
  pmVar6->v = 0;
  block = Variant::get<spirv_cross::SPIRBlock>
                    ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + local_3c)
  ;
  if ((block->merge == MergeLoop) && (bVar5 = post_order_visit(this,(block->merge_block).id), bVar5)
     ) {
    add_branch(this,local_3c,(block->merge_block).id);
  }
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  if (iVar1 == 3) {
    local_38 = this_00;
    pSVar7 = Compiler::get_case_list(this->compiler,block);
    sVar4 = (pSVar7->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size;
    if (sVar4 != 0) {
      pCVar2 = (pSVar7->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr;
      lVar14 = 0;
      do {
        bVar5 = post_order_visit(this,*(uint32_t *)((long)&(pCVar2->block).id + lVar14));
        if (bVar5) {
          add_branch(this,local_3c,*(uint32_t *)((long)&(pCVar2->block).id + lVar14));
        }
        lVar14 = lVar14 + 0x10;
      } while (sVar4 << 4 != lVar14);
    }
    this_00 = local_38;
    uVar10 = (block->default_block).id;
    if ((uVar10 != 0) && (bVar5 = post_order_visit(this,uVar10), bVar5)) {
      uVar10 = (block->default_block).id;
      goto LAB_002a9131;
    }
  }
  else if (iVar1 == 2) {
    bVar5 = post_order_visit(this,(block->true_block).id);
    if (bVar5) {
      add_branch(this,local_3c,(block->true_block).id);
    }
    bVar5 = post_order_visit(this,(block->false_block).id);
    if (bVar5) {
      uVar10 = (block->false_block).id;
      goto LAB_002a9131;
    }
  }
  else if ((iVar1 == 1) && (bVar5 = post_order_visit(this,(block->next_block).id), bVar5)) {
    uVar10 = (block->next_block).id;
LAB_002a9131:
    add_branch(this,local_3c,uVar10);
  }
  if ((block->merge != MergeSelection) ||
     (bVar5 = post_order_visit(this,(block->next_block).id), !bVar5)) goto LAB_002a9280;
  uVar10 = (block->next_block).id;
  uVar3 = (this->preceding_edges)._M_h._M_bucket_count;
  uVar9 = (ulong)uVar10 % uVar3;
  p_Var11 = (this->preceding_edges)._M_h._M_buckets[uVar9];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var12 = p_Var11->_M_nxt, p_Var13 = p_Var11,
     uVar10 != *(uint32_t *)&p_Var11->_M_nxt[1]._M_nxt)) {
    while (p_Var11 = p_Var12, p_Var12 = p_Var11->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var12[1]._M_nxt % uVar3 != uVar9) ||
         (p_Var13 = p_Var11, uVar10 == *(uint *)&p_Var12[1]._M_nxt)) goto LAB_002a91b8;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_002a91b8:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var12 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var12 = p_Var13->_M_nxt;
  }
  if (p_Var12 != (_Hash_node_base *)0x0) {
    uVar3 = (this->succeeding_edges)._M_h._M_bucket_count;
    uVar9 = (ulong)local_3c % uVar3;
    p_Var11 = (this->succeeding_edges)._M_h._M_buckets[uVar9];
    p_Var13 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var11->_M_nxt, p_Var13 = p_Var11, local_3c != *(uint *)&p_Var11->_M_nxt[1]._M_nxt
       )) {
      while (p_Var11 = p_Var8, p_Var8 = p_Var11->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var13 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar3 != uVar9) ||
           (p_Var13 = p_Var11, local_3c == *(uint *)&p_Var8[1]._M_nxt)) goto LAB_002a9231;
      }
      p_Var13 = (__node_base_ptr)0x0;
    }
LAB_002a9231:
    if (p_Var13 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var13->_M_nxt;
    }
    if (p_Var8 == (_Hash_node_base *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = p_Var8[3]._M_nxt == (_Hash_node_base *)0x1;
    }
    if ((bVar5) && (*(int *)&(block->super_IVariant).field_0xc == 3)) {
      if (p_Var12[3]._M_nxt == (_Hash_node_base *)0x0) goto LAB_002a9280;
    }
    else if ((p_Var12[3]._M_nxt != (_Hash_node_base *)0x1) ||
            (*(uint *)&(p_Var12[2]._M_nxt)->_M_nxt == local_3c)) goto LAB_002a9280;
  }
  add_branch(this,local_3c,uVar10);
LAB_002a9280:
  uVar10 = this->visit_count + 1;
  this->visit_count = uVar10;
  pmVar6 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CFG::VisitOrder>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_3c);
  pmVar6->v = uVar10;
  SmallVector<unsigned_int,_8UL>::reserve
            (&this->post_order,(this->post_order).super_VectorView<unsigned_int>.buffer_size + 1);
  sVar4 = (this->post_order).super_VectorView<unsigned_int>.buffer_size;
  (this->post_order).super_VectorView<unsigned_int>.ptr[sVar4] = local_3c;
  (this->post_order).super_VectorView<unsigned_int>.buffer_size = sVar4 + 1;
  return true;
}

Assistant:

bool CFG::post_order_visit(uint32_t block_id)
{
	// If we have already branched to this block (back edge), stop recursion.
	// If our branches are back-edges, we do not record them.
	// We have to record crossing edges however.
	if (has_visited_forward_edge(block_id))
		return true;
	else if (is_back_edge(block_id))
		return false;

	// Block back-edges from recursively revisiting ourselves.
	visit_order[block_id].get() = 0;

	auto &block = compiler.get<SPIRBlock>(block_id);

	// If this is a loop header, add an implied branch to the merge target.
	// This is needed to avoid annoying cases with do { ... } while(false) loops often generated by inliners.
	// To the CFG, this is linear control flow, but we risk picking the do/while scope as our dominating block.
	// This makes sure that if we are accessing a variable outside the do/while, we choose the loop header as dominator.
	// We could use has_visited_forward_edge, but this break code-gen where the merge block is unreachable in the CFG.

	// Make a point out of visiting merge target first. This is to make sure that post visit order outside the loop
	// is lower than inside the loop, which is going to be key for some traversal algorithms like post-dominance analysis.
	// For selection constructs true/false blocks will end up visiting the merge block directly and it works out fine,
	// but for loops, only the header might end up actually branching to merge block.
	if (block.merge == SPIRBlock::MergeLoop && post_order_visit(block.merge_block))
		add_branch(block_id, block.merge_block);

	// First visit our branch targets.
	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		if (post_order_visit(block.next_block))
			add_branch(block_id, block.next_block);
		break;

	case SPIRBlock::Select:
		if (post_order_visit(block.true_block))
			add_branch(block_id, block.true_block);
		if (post_order_visit(block.false_block))
			add_branch(block_id, block.false_block);
		break;

	case SPIRBlock::MultiSelect:
	{
		const auto &cases = compiler.get_case_list(block);
		for (const auto &target : cases)
		{
			if (post_order_visit(target.block))
				add_branch(block_id, target.block);
		}
		if (block.default_block && post_order_visit(block.default_block))
			add_branch(block_id, block.default_block);
		break;
	}
	default:
		break;
	}

	// If this is a selection merge, add an implied branch to the merge target.
	// This is needed to avoid cases where an inner branch dominates the outer branch.
	// This can happen if one of the branches exit early, e.g.:
	// if (cond) { ...; break; } else { var = 100 } use_var(var);
	// We can use the variable without a Phi since there is only one possible parent here.
	// However, in this case, we need to hoist out the inner variable to outside the branch.
	// Use same strategy as loops.
	if (block.merge == SPIRBlock::MergeSelection && post_order_visit(block.next_block))
	{
		// If there is only one preceding edge to the merge block and it's not ourselves, we need a fixup.
		// Add a fake branch so any dominator in either the if (), or else () block, or a lone case statement
		// will be hoisted out to outside the selection merge.
		// If size > 1, the variable will be automatically hoisted, so we should not mess with it.
		// The exception here is switch blocks, where we can have multiple edges to merge block,
		// all coming from same scope, so be more conservative in this case.
		// Adding fake branches unconditionally breaks parameter preservation analysis,
		// which looks at how variables are accessed through the CFG.
		auto pred_itr = preceding_edges.find(block.next_block);
		if (pred_itr != end(preceding_edges))
		{
			auto &pred = pred_itr->second;
			auto succ_itr = succeeding_edges.find(block_id);
			size_t num_succeeding_edges = 0;
			if (succ_itr != end(succeeding_edges))
				num_succeeding_edges = succ_itr->second.size();

			if (block.terminator == SPIRBlock::MultiSelect && num_succeeding_edges == 1)
			{
				// Multiple branches can come from the same scope due to "break;", so we need to assume that all branches
				// come from same case scope in worst case, even if there are multiple preceding edges.
				// If we have more than one succeeding edge from the block header, it should be impossible
				// to have a dominator be inside the block.
				// Only case this can go wrong is if we have 2 or more edges from block header and
				// 2 or more edges to merge block, and still have dominator be inside a case label.
				if (!pred.empty())
					add_branch(block_id, block.next_block);
			}
			else
			{
				if (pred.size() == 1 && *pred.begin() != block_id)
					add_branch(block_id, block.next_block);
			}
		}
		else
		{
			// If the merge block does not have any preceding edges, i.e. unreachable, hallucinate it.
			// We're going to do code-gen for it, and domination analysis requires that we have at least one preceding edge.
			add_branch(block_id, block.next_block);
		}
	}

	// Then visit ourselves. Start counting at one, to let 0 be a magic value for testing back vs. crossing edges.
	visit_order[block_id].get() = ++visit_count;
	post_order.push_back(block_id);
	return true;
}